

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_recon.c
# Opt level: O0

void ihevc_recon_16x16(WORD16 *pi2_src,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
                      WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols)

{
  UWORD8 local_38;
  UWORD8 local_34;
  WORD32 trans_size;
  WORD32 j;
  WORD32 i;
  WORD32 dst_strd_local;
  WORD32 pred_strd_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_dst_local;
  UWORD8 *pu1_pred_local;
  WORD16 *pi2_src_local;
  
  pu1_dst_local = pu1_dst;
  pu1_pred_local = pu1_pred;
  pi2_src_local = pi2_src;
  for (i = 0; i < 0x10; i = i + 1) {
    if ((zero_cols & 1U) == 1) {
      for (j = 0; j < 0x10; j = j + 1) {
        pu1_dst_local[j * dst_strd] = pu1_pred_local[j * pred_strd];
      }
    }
    else {
      for (j = 0; j < 0x10; j = j + 1) {
        if ((int)((int)pi2_src_local[j * src_strd] + (uint)pu1_pred_local[j * pred_strd]) < 0x100) {
          if ((int)((int)pi2_src_local[j * src_strd] + (uint)pu1_pred_local[j * pred_strd]) < 0) {
            local_38 = '\0';
          }
          else {
            local_38 = (char)pi2_src_local[j * src_strd] + pu1_pred_local[j * pred_strd];
          }
          local_34 = local_38;
        }
        else {
          local_34 = 0xff;
        }
        pu1_dst_local[j * dst_strd] = local_34;
      }
    }
    pi2_src_local = pi2_src_local + 1;
    pu1_dst_local = pu1_dst_local + 1;
    pu1_pred_local = pu1_pred_local + 1;
    zero_cols = zero_cols >> 1;
  }
  return;
}

Assistant:

void ihevc_recon_16x16(WORD16 *pi2_src,
                       UWORD8 *pu1_pred,
                       UWORD8 *pu1_dst,
                       WORD32 src_strd,
                       WORD32 pred_strd,
                       WORD32 dst_strd,
                       WORD32 zero_cols)
{
    WORD32 i, j;
    WORD32 trans_size;

    trans_size = TRANS_SIZE_16;

    /* Reconstruction */

    for(i = 0; i < trans_size; i++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] = pu1_pred[j * pred_strd];
            }
        }
        else
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] =
                                CLIP_U8(pi2_src[j * src_strd] + pu1_pred[j * pred_strd]);
            }
        }
        pi2_src++;
        pu1_dst++;
        pu1_pred++;
        zero_cols = zero_cols >> 1;
    }
}